

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::TestClearColor<unsigned_int>
          (ClearTest *this,GLenum buffer,GLenum attachment,uint value)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  bool bVar5;
  uint pixel;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x558))(attachment);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glDrawBuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x923);
  bVar5 = false;
  bVar1 = ClearColor<unsigned_int>(this,buffer,0,value);
  if (bVar1) {
    pixel = 0;
    (**(code **)(lVar4 + 0x1218))(attachment);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadBuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x92c);
    (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x8d94,0x1405,&pixel);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glReadPixel has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x92f);
    if (pixel == value) {
      bVar5 = true;
    }
    else {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"ClearNamedFramebuffer did not cleared color attachment ");
      local_1c0.m_getName = glu::getFramebufferAttachmentName;
      local_1c0.m_value = attachment;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
      std::operator<<((ostream *)this_00," of the framebuffer.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool ClearTest::TestClearColor(glw::GLenum buffer, glw::GLenum attachment, T value)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.drawBuffer(attachment);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

	/* Clear. */
	if (ClearColor<T>(buffer, 0, value))
	{
		/* Fetching framebuffer content. */
		T pixel = (T)0;

		gl.readBuffer(attachment);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer has failed");

		gl.readPixels(0, 0, 1, 1, Format<T>(), Type<T>(), &pixel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixel has failed");

		/* Comparison with reference value. */
		if (Compare(pixel, value))
		{
			return true;
		}

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "ClearNamedFramebuffer did not cleared color attachment "
			<< glu::getFramebufferAttachmentStr(attachment) << " of the framebuffer." << tcu::TestLog::EndMessage;
	}

	return false;
}